

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_offset_datetime<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  failure<toml::error_info> *__return_storage_ptr___00;
  undefined8 uVar1;
  uchar uVar4;
  value_type vVar5;
  element_type *peVar6;
  long lVar7;
  pointer puVar8;
  uchar *puVar9;
  error_type *this;
  value_type *pvVar10;
  value_type *pvVar11;
  uint *puVar12;
  error_type *this_00;
  value_type *pvVar13;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last;
  error_info *v;
  error_info *v_00;
  basic_value<toml::type_config> *pbVar14;
  long lVar15;
  scanner_storage *other;
  undefined1 auVar16 [8];
  size_t sVar17;
  region *this_01;
  size_t sVar18;
  _Alloc_hider _Var19;
  uint uVar20;
  ushort uVar21;
  undefined1 auVar22 [16];
  source_location src;
  result<int,_toml::detail::none_t> minute_r;
  result<int,_toml::detail::none_t> hour_r;
  string ofs_str;
  location first;
  result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
  time_fmt_reg;
  region ofs_reg;
  result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
  date_fmt_reg;
  undefined1 local_ab8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_aa8;
  undefined1 local_a98 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_a70 [2];
  undefined1 local_a48 [8];
  undefined1 auStack_a40 [8];
  undefined1 auStack_a38 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a28 [2];
  undefined8 uStack_a08;
  undefined1 local_a00 [24];
  undefined1 local_9e8 [8];
  undefined1 auStack_9e0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_9c8;
  char *local_9c0;
  _func_int **pp_Stack_9b8;
  size_t local_9b0;
  size_t sStack_9a8;
  size_t local_9a0;
  undefined1 local_998 [16];
  pointer local_988;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *local_980;
  result<int,_toml::detail::none_t> local_978;
  result<int,_toml::detail::none_t> local_970;
  string local_968;
  undefined1 local_948 [16];
  pointer local_938;
  pointer local_930;
  long local_928;
  ulong local_920;
  string local_918;
  string local_8f8;
  string local_8d8;
  string local_8b8;
  string local_898;
  string local_878;
  string local_858;
  string local_838;
  string local_818;
  string local_7f8;
  location local_7d8;
  undefined1 local_790 [48];
  pointer local_760;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_758;
  char *local_750;
  _func_int **pp_Stack_748;
  size_t local_740;
  size_t sStack_738;
  size_t local_730;
  undefined1 local_728 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_718;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_708;
  undefined8 local_6f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6e0 [4];
  undefined8 local_698;
  undefined8 uStack_690;
  region local_680;
  element_type *local_618;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_610;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_608;
  pointer psStack_600;
  pointer local_5f8;
  pointer ppStack_5f0;
  undefined4 local_5e8;
  undefined4 uStack_5e4;
  undefined4 uStack_5e0;
  undefined4 uStack_5dc;
  _Alloc_hider local_5d8;
  _func_int **local_5d0;
  char local_5c8 [16];
  pointer local_5b8;
  pointer pbStack_5b0;
  pointer local_5a8;
  element_type *local_598;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_590;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_588;
  pointer psStack_580;
  pointer local_578;
  pointer ppStack_570;
  undefined4 local_568;
  undefined4 uStack_564;
  undefined4 uStack_560;
  undefined4 uStack_55c;
  _Alloc_hider local_558;
  _func_int **local_550;
  char local_548 [16];
  pointer local_538;
  pointer pbStack_530;
  pointer local_528;
  element_type *local_518;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_510;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_508;
  pointer psStack_500;
  pointer local_4f8;
  pointer ppStack_4f0;
  undefined4 local_4e8;
  undefined4 uStack_4e4;
  undefined4 uStack_4e0;
  undefined4 uStack_4dc;
  _Alloc_hider local_4d8;
  _func_int **local_4d0;
  char local_4c8 [16];
  pointer local_4b8;
  pointer pbStack_4b0;
  pointer local_4a8;
  location local_498;
  undefined1 local_450 [120];
  source_location local_3d8;
  basic_value<toml::type_config> local_360;
  failure<toml::error_info> local_298;
  undefined1 local_240 [176];
  failure<toml::error_info> local_190;
  failure<toml::error_info> local_138;
  failure<toml::error_info> local_e0;
  failure<toml::error_info> local_88;
  undefined2 uVar2;
  undefined2 uVar3;
  
  location::location(&local_7d8,loc);
  parse_local_date_only<toml::type_config>
            ((result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
              *)local_450,loc,ctx);
  if (local_450[0] == false) {
    this = result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
           ::unwrap_err((result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
                         *)local_450,(source_location)0x5600e0);
    err<toml::error_info&>((failure<toml::error_info> *)local_240,(toml *)this,v);
    __return_storage_ptr__->is_ok_ = false;
    this_01 = (region *)local_240;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
               (failure<toml::error_info> *)this_01);
  }
  else {
    peVar6 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    last._M_current = (uchar *)loc->location_;
    lVar7 = (long)(peVar6->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    puVar9 = (peVar6->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish + -lVar7;
    if (puVar9 <= last._M_current) {
LAB_003c1664:
      region::region((region *)local_728,loc);
      source_location::source_location((source_location *)local_a48,(region *)local_728);
      region::~region((region *)local_728);
      local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_7f8,
                 "toml::parse_offset_datetime: expect date-time delimiter `T` or ` `(space).","");
      local_4d8._M_p = local_4c8;
      local_4e8 = local_a28[1]._0_4_;
      uStack_4e4 = local_a28[1]._4_4_;
      uStack_4e0 = local_a28[1]._8_4_;
      uStack_4dc = local_a28[1]._12_4_;
      local_4f8 = (pointer)local_a28[0]._0_8_;
      ppStack_4f0 = (pointer)local_a28[0]._8_8_;
      local_508 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)auStack_a38._0_8_;
      psStack_500 = (pointer)auStack_a38._8_8_;
      local_518 = (element_type *)local_a48;
      paStack_510 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)auStack_a40;
      if ((undefined1 *)uStack_a08 == local_a00 + 8) {
        local_4c8[8] = local_a00[0x10];
        local_4c8[9] = local_a00[0x11];
        local_4c8[10] = local_a00[0x12];
        local_4c8[0xb] = local_a00[0x13];
        local_4c8[0xc] = local_a00[0x14];
        local_4c8[0xd] = local_a00[0x15];
        local_4c8[0xe] = local_a00[0x16];
        local_4c8[0xf] = local_a00[0x17];
      }
      else {
        local_4d8._M_p = (pointer)uStack_a08;
      }
      local_4d0 = (_func_int **)local_a00._0_8_;
      local_a00._0_8_ = (_func_int **)0x0;
      local_a00._8_8_ = local_a00._8_8_ & 0xffffffffffffff00;
      local_4b8 = (pointer)local_9e8;
      pbStack_4b0 = (pointer)auStack_9e0._0_8_;
      local_4a8 = (pointer)auStack_9e0._8_8_;
      _local_9e8 = (undefined1  [16])0x0;
      auStack_9e0._8_8_ = (pointer)0x0;
      uStack_a08 = local_a00 + 8;
      local_818._M_dataplus._M_p = (pointer)&local_818.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_818,"here","");
      make_error_info<>((error_info *)local_728,&local_7f8,(source_location *)&local_518,&local_818)
      ;
      err<toml::error_info>(&local_88,(error_info *)local_728);
      __return_storage_ptr__->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_88);
      failure<toml::error_info>::~failure(&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f0 != local_6e0) {
        operator_delete((void *)local_6f0,local_6e0[0]._M_allocated_capacity + 1);
      }
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_708);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_728._1_7_,local_728[0]) != &local_718) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_728._1_7_,local_728[0]),
                        (ulong)(local_718._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_818._M_dataplus._M_p != &local_818.field_2) {
        operator_delete(local_818._M_dataplus._M_p,local_818.field_2._M_allocated_capacity + 1);
      }
      source_location::~source_location((source_location *)&local_518);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
        operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
      }
      source_location::~source_location((source_location *)local_a48);
      goto LAB_003c2709;
    }
    uVar4 = last._M_current[lVar7];
    if (uVar4 == ' ') {
      lVar15 = 2;
      if (last._M_current + 1 < puVar9) {
LAB_003c18f2:
        puVar9 = last._M_current + 1;
        loc->column_number_ = loc->column_number_ + 1;
      }
      else {
        sVar17 = loc->line_number_;
        sVar18 = loc->column_number_;
        do {
          if (last._M_current[lVar7] == '\n') {
            sVar17 = sVar17 + 1;
            loc->line_number_ = sVar17;
            sVar18 = 1;
          }
          else {
            sVar18 = sVar18 + 1;
          }
          loc->column_number_ = sVar18;
          last._M_current = last._M_current + 1;
        } while (puVar9 != last._M_current);
        lVar15 = 2;
      }
    }
    else if (uVar4 == 't') {
      lVar15 = 1;
      if (last._M_current + 1 < puVar9) goto LAB_003c18f2;
      sVar17 = loc->line_number_;
      sVar18 = loc->column_number_;
      do {
        if (last._M_current[lVar7] == '\n') {
          sVar17 = sVar17 + 1;
          loc->line_number_ = sVar17;
          sVar18 = 1;
        }
        else {
          sVar18 = sVar18 + 1;
        }
        loc->column_number_ = sVar18;
        last._M_current = last._M_current + 1;
      } while (puVar9 != last._M_current);
      lVar15 = 1;
    }
    else {
      if (uVar4 != 'T') goto LAB_003c1664;
      if (last._M_current + 1 < puVar9) {
        lVar15 = 0;
        goto LAB_003c18f2;
      }
      sVar17 = loc->line_number_;
      sVar18 = loc->column_number_;
      lVar15 = 0;
      do {
        if (last._M_current[lVar7] == '\n') {
          sVar17 = sVar17 + 1;
          loc->line_number_ = sVar17;
          sVar18 = 1;
        }
        else {
          sVar18 = sVar18 + 1;
        }
        loc->column_number_ = sVar18;
        last._M_current = last._M_current + 1;
      } while (puVar9 != last._M_current);
    }
    loc->location_ = (size_t)puVar9;
    parse_local_time_only<toml::type_config>
              ((result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                *)local_728,loc,ctx);
    if (local_728[0] == false) {
      this_00 = result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                ::unwrap_err((result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                              *)local_728,(source_location)0x5600f8);
      err<toml::error_info&>(&local_298,(toml *)this_00,v_00);
      __return_storage_ptr__->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_298);
      failure<toml::error_info>::~failure(&local_298);
    }
    else {
      pvVar10 = result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                ::unwrap((result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                          *)local_728,(source_location)0x560110);
      local_920 = (ulong)(pvVar10->
                         super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                         ).
                         super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
                         super__Head_base<1UL,_toml::local_time_format_info,_false>._M_head_impl.
                         has_seconds;
      pvVar10 = result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                ::unwrap((result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                          *)local_728,(source_location)0x560128);
      local_930 = (pointer)(pvVar10->
                           super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                           ).
                           super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>
                           .super__Head_base<1UL,_toml::local_time_format_info,_false>._M_head_impl.
                           subsecond_precision;
      local_980 = __return_storage_ptr__;
      local_928 = lVar15;
      syntax::time_offset((either *)local_a48,&ctx->toml_spec_);
      uVar1 = auStack_a38._0_8_;
      if (auStack_a40 != (undefined1  [8])auStack_a38._0_8_) {
        auVar16 = auStack_a40;
        do {
          (**(code **)(**(long **)auVar16 + 0x10))(&local_680,*(long **)auVar16,loc);
          if (local_680.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr != (element_type *)0x0) goto LAB_003c1a30;
          region::~region(&local_680);
          auVar16 = (undefined1  [8])((long)auVar16 + 8);
        } while (auVar16 != (undefined1  [8])uVar1);
      }
      region::region(&local_680);
LAB_003c1a30:
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
               *)auStack_a40);
      if (local_680.source_.
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr == (element_type *)0x0) {
        local_838._M_dataplus._M_p = (pointer)&local_838.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_838,
                   "toml::parse_offset_datetime: invalid offset: offset must be like: Z, +01:00, or -10:00."
                   ,"");
        __return_storage_ptr__ = local_980;
        syntax::time_offset((either *)local_ab8,&ctx->toml_spec_);
        location::location(&local_498,loc);
        local_858._M_dataplus._M_p = (pointer)&local_858.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_858,"");
        make_syntax_error<toml::detail::either>
                  ((error_info *)local_a48,&local_838,(either *)local_ab8,&local_498,&local_858);
        err<toml::error_info>(&local_e0,(error_info *)local_a48);
        __return_storage_ptr__->is_ok_ = false;
        failure<toml::error_info>::failure
                  ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_e0);
        failure<toml::error_info>::~failure(&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a28[1]._8_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a00) {
          operator_delete((void *)local_a28[1]._8_8_,(ulong)(local_a00._0_8_ + 1));
        }
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_a28);
        if (local_a48 != (undefined1  [8])auStack_a38) {
          operator_delete((void *)local_a48,auStack_a38._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_858._M_dataplus._M_p != &local_858.field_2) {
          operator_delete(local_858._M_dataplus._M_p,local_858.field_2._M_allocated_capacity + 1);
        }
        location::~location(&local_498);
        std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
        ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                 *)(local_ab8 + 8));
        local_968._M_dataplus._M_p = local_838._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_838._M_dataplus._M_p != &local_838.field_2) goto LAB_003c26dd;
      }
      else {
        puVar8 = ((local_680.source_.
                   super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        make_string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (&local_968,(detail *)(puVar8 + local_680.first_),
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(puVar8 + local_680.last_),last);
        __return_storage_ptr__ = local_980;
        if (local_968._M_string_length == 0) {
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",0,0);
        }
        if ((*local_968._M_dataplus._M_p == '-') || (*local_968._M_dataplus._M_p == '+')) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_968,1,2
                );
          from_string<int>((detail *)&local_970,(string *)local_a48);
          if (local_a48 != (undefined1  [8])auStack_a38) {
            operator_delete((void *)local_a48,auStack_a38._0_8_ + 1);
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_968,4,2
                );
          from_string<int>((detail *)&local_978,(string *)local_a48);
          if (local_a48 != (undefined1  [8])auStack_a38) {
            operator_delete((void *)local_a48,auStack_a38._0_8_ + 1);
          }
          if (local_970.is_ok_ == false) {
            region::region((region *)local_ab8,loc);
            source_location::source_location((source_location *)local_a48,(region *)local_ab8);
            region::~region((region *)local_ab8);
            local_878._M_dataplus._M_p = (pointer)&local_878.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_878,
                       "toml::parse_offset_datetime: Failed to read offset hour part","");
            local_558._M_p = local_548;
            local_568 = local_a28[1]._0_4_;
            uStack_564 = local_a28[1]._4_4_;
            uStack_560 = local_a28[1]._8_4_;
            uStack_55c = local_a28[1]._12_4_;
            local_578 = (pointer)local_a28[0]._0_8_;
            ppStack_570 = (pointer)local_a28[0]._8_8_;
            local_588 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)auStack_a38._0_8_;
            psStack_580 = (pointer)auStack_a38._8_8_;
            local_598 = (element_type *)local_a48;
            paStack_590 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)auStack_a40;
            if ((undefined1 *)uStack_a08 == local_a00 + 8) {
              local_548[8] = local_a00[0x10];
              local_548[9] = local_a00[0x11];
              local_548[10] = local_a00[0x12];
              local_548[0xb] = local_a00[0x13];
              local_548[0xc] = local_a00[0x14];
              local_548[0xd] = local_a00[0x15];
              local_548[0xe] = local_a00[0x16];
              local_548[0xf] = local_a00[0x17];
            }
            else {
              local_558._M_p = (pointer)uStack_a08;
            }
            local_550 = (_func_int **)local_a00._0_8_;
            local_a00._0_8_ = (_func_int **)0x0;
            local_a00._8_8_ = local_a00._8_8_ & 0xffffffffffffff00;
            local_538 = (pointer)local_9e8;
            pbStack_530 = (pointer)auStack_9e0._0_8_;
            local_528 = (pointer)auStack_9e0._8_8_;
            _local_9e8 = (undefined1  [16])0x0;
            auStack_9e0._8_8_ = (pointer)0x0;
            uStack_a08 = local_a00 + 8;
            local_898._M_dataplus._M_p = (pointer)&local_898.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_898,"here","");
            make_error_info<>((error_info *)local_ab8,&local_878,(source_location *)&local_598,
                              &local_898);
            err<toml::error_info>(&local_138,(error_info *)local_ab8);
            __return_storage_ptr__->is_ok_ = false;
            failure<toml::error_info>::failure
                      ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
                       &local_138);
            failure<toml::error_info>::~failure(&local_138);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a98._24_8_ != aaStack_a70) {
              operator_delete((void *)local_a98._24_8_,
                              (ulong)(aaStack_a70[0]._M_allocated_capacity + 1));
            }
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_a98);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_ab8._0_8_ != &local_aa8) {
              operator_delete((void *)local_ab8._0_8_,(ulong)(local_aa8._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_898._M_dataplus._M_p != &local_898.field_2) {
              operator_delete(local_898._M_dataplus._M_p,local_898.field_2._M_allocated_capacity + 1
                             );
            }
            source_location::~source_location((source_location *)&local_598);
            _Var19._M_p = local_878._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_878._M_dataplus._M_p != &local_878.field_2) {
LAB_003c2238:
              operator_delete(_Var19._M_p,local_878.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            if (local_978.is_ok_ != false) {
              pvVar11 = result<int,_toml::detail::none_t>::unwrap
                                  (&local_970,(source_location)0x560140);
              vVar5 = *pvVar11;
              puVar12 = (uint *)result<int,_toml::detail::none_t>::unwrap
                                          (&local_978,(source_location)0x560158);
              if (local_968._M_string_length == 0) {
                std::__throw_out_of_range_fmt
                          ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",0,0
                          );
              }
              uVar21 = (ushort)(byte)-(char)vVar5;
              if (*local_968._M_dataplus._M_p == '+') {
                uVar21 = (ushort)vVar5;
              }
              uVar20 = (uint)(byte)-(char)*puVar12;
              if (*local_968._M_dataplus._M_p == '+') {
                uVar20 = *puVar12;
              }
              goto LAB_003c1d69;
            }
            region::region((region *)local_ab8,loc);
            source_location::source_location((source_location *)local_a48,(region *)local_ab8);
            region::~region((region *)local_ab8);
            local_8b8._M_dataplus._M_p = (pointer)&local_8b8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_8b8,
                       "toml::parse_offset_datetime: Failed to read offset minute part","");
            local_5d8._M_p = local_5c8;
            local_5e8 = local_a28[1]._0_4_;
            uStack_5e4 = local_a28[1]._4_4_;
            uStack_5e0 = local_a28[1]._8_4_;
            uStack_5dc = local_a28[1]._12_4_;
            local_5f8 = (pointer)local_a28[0]._0_8_;
            ppStack_5f0 = (pointer)local_a28[0]._8_8_;
            local_608 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)auStack_a38._0_8_;
            psStack_600 = (pointer)auStack_a38._8_8_;
            local_618 = (element_type *)local_a48;
            paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)auStack_a40;
            if ((undefined1 *)uStack_a08 == local_a00 + 8) {
              local_5c8[8] = local_a00[0x10];
              local_5c8[9] = local_a00[0x11];
              local_5c8[10] = local_a00[0x12];
              local_5c8[0xb] = local_a00[0x13];
              local_5c8[0xc] = local_a00[0x14];
              local_5c8[0xd] = local_a00[0x15];
              local_5c8[0xe] = local_a00[0x16];
              local_5c8[0xf] = local_a00[0x17];
            }
            else {
              local_5d8._M_p = (pointer)uStack_a08;
            }
            local_5d0 = (_func_int **)local_a00._0_8_;
            local_a00._0_8_ = (_func_int **)0x0;
            local_a00._8_8_ = local_a00._8_8_ & 0xffffffffffffff00;
            local_5b8 = (pointer)local_9e8;
            pbStack_5b0 = (pointer)auStack_9e0._0_8_;
            local_5a8 = (pointer)auStack_9e0._8_8_;
            _local_9e8 = (undefined1  [16])0x0;
            auStack_9e0._8_8_ = (pointer)0x0;
            uStack_a08 = local_a00 + 8;
            local_8d8._M_dataplus._M_p = (pointer)&local_8d8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d8,"here","");
            make_error_info<>((error_info *)local_ab8,&local_8b8,(source_location *)&local_618,
                              &local_8d8);
            err<toml::error_info>(&local_190,(error_info *)local_ab8);
            __return_storage_ptr__->is_ok_ = false;
            failure<toml::error_info>::failure
                      ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
                       &local_190);
            failure<toml::error_info>::~failure(&local_190);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a98._24_8_ != aaStack_a70) {
              operator_delete((void *)local_a98._24_8_,
                              (ulong)(aaStack_a70[0]._M_allocated_capacity + 1));
            }
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_a98);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_ab8._0_8_ != &local_aa8) {
              operator_delete((void *)local_ab8._0_8_,(ulong)(local_aa8._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
              operator_delete(local_8d8._M_dataplus._M_p,local_8d8.field_2._M_allocated_capacity + 1
                             );
            }
            source_location::~source_location((source_location *)&local_618);
            local_878.field_2._M_allocated_capacity = local_8b8.field_2._M_allocated_capacity;
            _Var19._M_p = local_8b8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_8b8._M_dataplus._M_p != &local_8b8.field_2) goto LAB_003c2238;
          }
          source_location::~source_location((source_location *)local_a48);
        }
        else {
          uVar21 = 0;
          uVar20 = 0;
LAB_003c1d69:
          if (((byte)((char)uVar21 - 0x19U) < 0xcf) || ((byte)((char)uVar20 - 0x3dU) < 0x87)) {
            local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_8f8,
                       "toml::parse_offset_datetime: too large offset: |hour| <= 24, |minute| <= 60"
                       ,"");
            local_a48 = (undefined1  [8])
                        local_7d8.source_.
                        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
            auStack_a40 = (undefined1  [8])
                          local_7d8.source_.
                          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7d8.source_.
                   super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_7d8.source_.
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_use_count =
                     (local_7d8.source_.
                      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_7d8.source_.
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_use_count =
                     (local_7d8.source_.
                      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            auStack_a38._0_8_ = local_a28;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)auStack_a38,local_7d8.source_name_._M_dataplus._M_p,
                       local_7d8.source_name_._M_dataplus._M_p +
                       local_7d8.source_name_._M_string_length);
            local_a28[1]._8_8_ = local_7d8.location_;
            uStack_a08 = local_7d8.line_number_;
            local_a00._0_8_ = local_7d8.column_number_;
            local_a00._8_8_ = loc->location_;
            local_a00._16_8_ = loc->line_number_;
            local_a28[1]._0_8_ = local_a00._8_8_ - local_7d8.location_;
            local_9e8 = (undefined1  [8])loc->column_number_;
            source_location::source_location(&local_3d8,(region *)local_a48);
            local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_918,"here","");
            make_error_info<>((error_info *)local_ab8,&local_8f8,&local_3d8,&local_918);
            __return_storage_ptr___00 = (failure<toml::error_info> *)(local_240 + 0x58);
            err<toml::error_info>(__return_storage_ptr___00,(error_info *)local_ab8);
            __return_storage_ptr__->is_ok_ = false;
            failure<toml::error_info>::failure
                      ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
                       __return_storage_ptr___00);
            failure<toml::error_info>::~failure(__return_storage_ptr___00);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a98._24_8_ != aaStack_a70) {
              operator_delete((void *)local_a98._24_8_,
                              (ulong)(aaStack_a70[0]._M_allocated_capacity + 1));
            }
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_a98);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_ab8._0_8_ != &local_aa8) {
              operator_delete((void *)local_ab8._0_8_,(ulong)(local_aa8._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_918._M_dataplus._M_p != &local_918.field_2) {
              operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1
                             );
            }
            source_location::~source_location(&local_3d8);
            region::~region((region *)local_a48);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
              operator_delete(local_8f8._M_dataplus._M_p,local_8f8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            local_ab8._0_8_ =
                 local_7d8.source_.
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
            local_ab8._8_8_ =
                 local_7d8.source_.
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7d8.source_.
                   super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_7d8.source_.
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_use_count =
                     (local_7d8.source_.
                      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_7d8.source_.
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_use_count =
                     (local_7d8.source_.
                      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            local_aa8._M_allocated_capacity = (size_type)(basic_value<toml::type_config> *)local_a98
            ;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_aa8,local_7d8.source_name_._M_dataplus._M_p,
                       local_7d8.source_name_._M_dataplus._M_p +
                       local_7d8.source_name_._M_string_length);
            local_a98._24_8_ = local_7d8.location_;
            local_a98._32_8_ = local_7d8.line_number_;
            aaStack_a70[0]._M_allocated_capacity = local_7d8.column_number_;
            aaStack_a70[0]._8_8_ = loc->location_;
            aaStack_a70[1]._0_8_ = loc->line_number_;
            local_a98._16_8_ = aaStack_a70[0]._8_8_ - local_7d8.location_;
            aaStack_a70[1]._8_8_ = loc->column_number_;
            pvVar13 = result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
                      ::unwrap((result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
                                *)local_450,(source_location)0x560170);
            local_698 = *(undefined8 *)
                         &(pvVar13->
                          super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
                          ).super__Head_base<0UL,_toml::local_date,_false>;
            uStack_690 = 0;
            pvVar10 = result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                      ::unwrap((result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                                *)local_728,(source_location)0x560188);
            local_9e8 = (undefined1  [8])local_aa8._8_8_;
            local_a00._8_8_ = local_ab8._8_8_;
            local_a00._0_8_ = local_ab8._0_8_;
            auStack_a38._8_8_ = local_928 + (ulong)(uint)((int)local_920 << 8);
            uVar1._0_1_ = (pvVar10->
                          super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                          ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.hour;
            uVar1._1_1_ = (pvVar10->
                          super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                          ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.minute;
            uVar1._2_1_ = (pvVar10->
                          super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                          ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.second;
            uVar1._3_1_ = (pvVar10->
                          super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                          ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.field_0x3;
            uVar2 = (pvVar10->
                    super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                    ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.millisecond;
            uVar3 = (pvVar10->
                    super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                    ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.microsecond;
            uVar1._4_4_ = CONCAT22(uVar3,uVar2);
            auVar22._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)CONCAT44((int)uVar1,(undefined4)local_698);
            auVar22._8_4_ = uVar1._4_4_;
            auVar22._12_4_ = local_698._4_4_;
            auStack_a38._0_8_ =
                 auVar22._8_8_ & 0xffffffff |
                 (ulong)(pvVar10->
                        super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                        ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.nanosecond <<
                 0x20 | (ulong)(ushort)(uVar21 & 0xff | (ushort)((uVar20 & 0xff) << 8)) << 0x30;
            local_ab8._0_8_ = (element_type *)0x0;
            local_ab8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_790._16_8_ = local_790 + 0x20;
            if ((basic_value<toml::type_config> *)local_aa8._M_allocated_capacity ==
                (basic_value<toml::type_config> *)local_a98) {
              local_790._40_8_ = local_a98._8_8_;
              local_aa8._M_allocated_capacity = local_790._16_8_;
            }
            local_790._33_7_ = local_a98._1_7_;
            local_790[0x20] = local_a98[0];
            local_aa8._8_8_ = (pointer)0x0;
            local_a98[0] = '\0';
            local_760 = (pointer)local_a98._16_8_;
            paStack_758 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_a98._24_8_;
            local_750 = (char *)local_a98._32_8_;
            pp_Stack_748 = (_func_int **)aaStack_a70[0]._0_8_;
            local_740 = aaStack_a70[0]._8_8_;
            sStack_738 = aaStack_a70[1]._0_8_;
            local_730 = aaStack_a70[1]._8_8_;
            local_a48[0] = 5;
            local_a28[0]._0_8_ = local_930;
            local_790._0_8_ = (element_type *)0x0;
            local_790._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            pbVar14 = (basic_value<toml::type_config> *)local_790._32_8_;
            local_a00._16_8_ = local_aa8._M_allocated_capacity;
            if (local_aa8._M_allocated_capacity == local_790._16_8_) {
              auStack_9e0._8_8_ = local_790._40_8_;
              pbVar14 = (basic_value<toml::type_config> *)local_aa8._M_allocated_capacity;
              local_a00._16_8_ = (basic_value<toml::type_config> *)(local_9e8 + 8);
            }
            auStack_9e0._0_8_ = local_790._32_8_;
            local_790._24_8_ = 0;
            local_790._32_8_ = (ulong)(uint7)local_a98._1_7_ << 8;
            auStack_9e0._16_8_ = local_a98._16_8_;
            paStack_9c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_a98._24_8_;
            local_9c0 = (char *)local_a98._32_8_;
            pp_Stack_9b8 = (_func_int **)aaStack_a70[0]._0_8_;
            local_9b0 = aaStack_a70[0]._8_8_;
            sStack_9a8 = aaStack_a70[1]._0_8_;
            local_9a0 = aaStack_a70[1]._8_8_;
            local_998 = (undefined1  [16])0x0;
            local_988 = (pointer)0x0;
            local_948 = (undefined1  [16])0x0;
            local_938 = (pointer)0x0;
            local_aa8._M_allocated_capacity = (size_type)(basic_value<toml::type_config> *)local_a98
            ;
            auStack_a40 = (undefined1  [8])auVar22._0_8_;
            ok<toml::basic_value<toml::type_config>>
                      ((success<toml::basic_value<toml::type_config>_> *)&local_360,
                       (toml *)local_a48,pbVar14);
            __return_storage_ptr__->is_ok_ = true;
            pbVar14 = &local_360;
            basic_value<toml::type_config>::basic_value
                      (&(__return_storage_ptr__->field_1).succ_.value,pbVar14);
            basic_value<toml::type_config>::cleanup(&local_360,(EVP_PKEY_CTX *)pbVar14);
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_360.comments_);
            region::~region(&local_360.region_);
            basic_value<toml::type_config>::cleanup
                      ((basic_value<toml::type_config> *)local_a48,(EVP_PKEY_CTX *)pbVar14);
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(auStack_9e0 + 0x48));
            region::~region((region *)local_a00);
            region::~region((region *)local_790);
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_948);
            region::~region((region *)local_ab8);
          }
        }
        local_838.field_2._M_allocated_capacity = local_968.field_2._M_allocated_capacity;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_968._M_dataplus._M_p != &local_968.field_2) {
LAB_003c26dd:
          operator_delete(local_968._M_dataplus._M_p,local_838.field_2._M_allocated_capacity + 1);
        }
      }
      region::~region(&local_680);
    }
    this_01 = (region *)(local_728 + 8);
    if (local_728[0] == true) {
      region::~region(this_01);
      goto LAB_003c2709;
    }
  }
  failure<toml::error_info>::~failure((failure<toml::error_info> *)this_01);
LAB_003c2709:
  if (local_450[0] == true) {
    region::~region((region *)(local_450 + 8));
  }
  else {
    failure<toml::error_info>::~failure((failure<toml::error_info> *)(local_450 + 8));
  }
  location::~location(&local_7d8);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_offset_datetime(location& loc, const context<TC>& ctx)
{
    using char_type = location::char_type;

    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    offset_datetime_format_info fmt;

    // ----------------------------------------------------------------------
    // date part

    auto date_fmt_reg = parse_local_date_only(loc, ctx);
    if(date_fmt_reg.is_err())
    {
        return err(date_fmt_reg.unwrap_err());
    }

    // ----------------------------------------------------------------------
    // delimiter

    if(loc.current() == char_type('T'))
    {
        loc.advance();
        fmt.delimiter = datetime_delimiter_kind::upper_T;
    }
    else if(loc.current() == char_type('t'))
    {
        loc.advance();
        fmt.delimiter = datetime_delimiter_kind::lower_t;
    }
    else if(loc.current() == char_type(' '))
    {
        loc.advance();
        fmt.delimiter = datetime_delimiter_kind::space;
    }
    else
    {
        auto src = source_location(region(loc));
        return err(make_error_info("toml::parse_offset_datetime: "
            "expect date-time delimiter `T` or ` `(space).", std::move(src), "here"
        ));
    }

    // ----------------------------------------------------------------------
    // time part

    auto time_fmt_reg = parse_local_time_only(loc, ctx);
    if(time_fmt_reg.is_err())
    {
        return err(time_fmt_reg.unwrap_err());
    }

    fmt.has_seconds         = std::get<1>(time_fmt_reg.unwrap()).has_seconds;
    fmt.subsecond_precision = std::get<1>(time_fmt_reg.unwrap()).subsecond_precision;

    // ----------------------------------------------------------------------
    // offset part

    const auto ofs_reg = syntax::time_offset(spec).scan(loc);
    if( ! ofs_reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_offset_datetime: "
            "invalid offset: offset must be like: Z, +01:00, or -10:00.",
            syntax::time_offset(spec), loc));
    }

    const auto ofs_str = ofs_reg.as_string();

    time_offset offset(0, 0);

    assert(ofs_str.size() != 0);

    if(ofs_str.at(0) == char_type('+') || ofs_str.at(0) == char_type('-'))
    {
        const auto hour_r   = from_string<int>(ofs_str.substr(1, 2));
        const auto minute_r = from_string<int>(ofs_str.substr(4, 2));
        if(hour_r.is_err())
        {
            auto src = source_location(region(loc));
            return err(make_error_info("toml::parse_offset_datetime: "
                "Failed to read offset hour part", std::move(src), "here"));
        }
        if(minute_r.is_err())
        {
            auto src = source_location(region(loc));
            return err(make_error_info("toml::parse_offset_datetime: "
                "Failed to read offset minute part", std::move(src), "here"));
        }
        const auto hour   = hour_r.unwrap();
        const auto minute = minute_r.unwrap();

        if(ofs_str.at(0) == '+')
        {
            offset = time_offset(hour, minute);
        }
        else
        {
            offset = time_offset(-hour, -minute);
        }
    }
    else
    {
        assert(ofs_str.at(0) == char_type('Z') || ofs_str.at(0) == char_type('z'));
    }

    if (offset.hour   < -24 || 24 < offset.hour ||
        offset.minute < -60 || 60 < offset.minute)
    {
        return err(make_error_info("toml::parse_offset_datetime: "
            "too large offset: |hour| <= 24, |minute| <= 60",
            source_location(region(first, loc)), "here"));
    }


    // ----------------------------------------------------------------------

    region reg(first, loc);
    offset_datetime val(local_datetime(std::get<0>(date_fmt_reg.unwrap()),
                                       std::get<0>(time_fmt_reg.unwrap())),
                                       offset);

    return ok(basic_value<TC>(val, std::move(fmt), {}, std::move(reg)));
}